

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O0

BitMatrix * ZXing::ParseBitMatrix(string *str,char one,bool expectSpace)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  BitMatrix *this;
  char *pcVar4;
  byte in_CL;
  char in_DL;
  ulong in_RSI;
  BitMatrix *in_RDI;
  int x;
  size_t offset;
  int y;
  int width;
  int height;
  int strStride;
  size_type lineLength;
  BitMatrix *mat;
  BitMatrix *this_00;
  int local_54;
  int local_48;
  ulong local_40;
  int in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  local_40 = std::__cxx11::string::find((char)in_RSI,10);
  if (local_40 == 0xffffffffffffffff) {
    memset(in_RDI,0,0x20);
    BitMatrix::BitMatrix((BitMatrix *)0x21ea51);
  }
  else {
    iVar2 = 1;
    if ((in_CL & 1) != 0) {
      iVar2 = 2;
    }
    uVar3 = std::__cxx11::string::length();
    this = (BitMatrix *)(uVar3 / (local_40 + 1));
    iVar1 = narrow_cast<int,unsigned_long>((unsigned_long *)&stack0xffffffffffffffd0);
    local_40 = local_40 / (ulong)(long)iVar2;
    iVar2 = narrow_cast<int,unsigned_long>(&local_40);
    BitMatrix::BitMatrix(this,iVar2,in_stack_ffffffffffffffc8);
    for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
      for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
        if (*pcVar4 == in_DL) {
          BitMatrix::set(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,false);
        }
      }
    }
  }
  return this_00;
}

Assistant:

BitMatrix ParseBitMatrix(const std::string& str, char one, bool expectSpace)
{
	auto lineLength = str.find('\n');
	if (lineLength == std::string::npos)
		return {};

	int strStride = expectSpace ? 2 : 1;
	int height = narrow_cast<int>(str.length() / (lineLength + 1));
	int width = narrow_cast<int>(lineLength / strStride);
	BitMatrix mat(width, height);
	for (int y = 0; y < height; ++y) {
		size_t offset = y * (lineLength + 1);
		for (int x = 0; x < width; ++x, offset += strStride) {
			if (str[offset] == one)
				mat.set(x, y);
		}
	}
	return mat;
}